

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

ArrayElementRef * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
          (PoolAllocator *this,Context *args,Expression *args_1,
          pool_ptr<soul::AST::Expression> *args_2,pool_ptr<soul::AST::Expression> *args_3,
          bool *args_4)

{
  bool bVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  SourceCodeText *pSVar4;
  Scope *pSVar5;
  PoolItem *pPVar6;
  
  pPVar6 = allocateSpaceForObject(this,0x50);
  pEVar2 = args_2->object;
  pEVar3 = args_3->object;
  bVar1 = *args_4;
  *(undefined4 *)&pPVar6->field_0x18 = 0x1e;
  pSVar4 = (args->location).sourceCode.object;
  pPVar6[1].size = (size_t)pSVar4;
  if (pSVar4 != (SourceCodeText *)0x0) {
    (pSVar4->super_RefCountedObject).refCount = (pSVar4->super_RefCountedObject).refCount + 1;
  }
  pSVar5 = args->parentScope;
  pPVar6[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar6[1].item = pSVar5;
  *(undefined4 *)&pPVar6[1].field_0x18 = 0;
  pPVar6->item = &PTR__ArrayElementRef_002f6508;
  pPVar6[2].size = (size_t)args_1;
  pPVar6[2].destructor = (DestructorFn *)pEVar2;
  pPVar6[2].item = pEVar3;
  pPVar6[2].field_0x18 = bVar1;
  pPVar6[2].field_0x19 = 0;
  pPVar6->destructor =
       allocate<soul::AST::ArrayElementRef,_const_soul::AST::Context_&,_soul::AST::Expression_&,_soul::pool_ptr<soul::AST::Expression>_&,_soul::pool_ptr<soul::AST::Expression>_&,_bool>
       ::anon_class_1_0_00000001::__invoke;
  return (ArrayElementRef *)&pPVar6->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }